

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

ON_XMLProperty * __thiscall
ON_XMLNodePropertyIteratorPrivate::GetNextPropertySorted(ON_XMLNodePropertyIteratorPrivate *this)

{
  int iVar1;
  pointer pOVar2;
  vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *pvVar3;
  ON_XMLProperty *pOVar4;
  recursive_mutex *__mutex;
  PropertyIterator pi;
  
  if (this->m_iIndex == 0) {
    __mutex = &this->m_pNode->_private->m_mutex;
    std::recursive_mutex::lock(__mutex);
    ON_XMLNode::PropertyIterator::PropertyIterator(&pi,this->m_pNode,false);
    ON_REMOVE_ASAP_AssertEx
              ((uint)(this->m_paSortedProperties ==
                     (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)0x0),
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0xe55,"","m_paSortedProperties == nullptr is false");
    pvVar3 = (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)operator_new(0x18);
    (pvVar3->super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pvVar3->super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar3->super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this->m_paSortedProperties = pvVar3;
    while( true ) {
      pOVar4 = ON_XMLNode::PropertyIterator::GetNextProperty(&pi);
      pvVar3 = this->m_paSortedProperties;
      if (pOVar4 == (ON_XMLProperty *)0x0) break;
      std::vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>::push_back(pvVar3,pOVar4);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<ON_XMLProperty*,std::vector<ON_XMLProperty,std::allocator<ON_XMLProperty>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((pvVar3->super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl
               .super__Vector_impl_data._M_start,
               (pvVar3->super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl
               .super__Vector_impl_data._M_finish);
    ON_XMLNode::PropertyIterator::~PropertyIterator(&pi);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  pOVar4 = (ON_XMLProperty *)0x0;
  ON_REMOVE_ASAP_AssertEx
            ((uint)(this->m_paSortedProperties !=
                   (vector<ON_XMLProperty,_std::allocator<ON_XMLProperty>_> *)0x0),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
             ,0xe61,"","m_paSortedProperties != nullptr is false");
  iVar1 = this->m_iIndex;
  pOVar2 = (this->m_paSortedProperties->
           super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar1 < (int)(((long)(this->m_paSortedProperties->
                           super__Vector_base<ON_XMLProperty,_std::allocator<ON_XMLProperty>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pOVar2) / 0x68)) {
    this->m_iIndex = iVar1 + 1;
    pOVar4 = pOVar2 + iVar1;
  }
  return pOVar4;
}

Assistant:

ON_XMLProperty* GetNextPropertySorted(void)
  {
    // First time through, we build the list.
    if (m_iIndex == 0)
    {
      // While sorting properties, don't allow anything else to access the parent node.
      std::lock_guard<std::recursive_mutex> lg(m_pNode->_private->m_mutex);

      ON_XMLNode::PropertyIterator pi(m_pNode, false);

      ON_ASSERT(m_paSortedProperties == nullptr);
      m_paSortedProperties = new std::vector<ON_XMLProperty>;

      ON_XMLProperty* p = nullptr;
      while (nullptr != (p = pi.GetNextProperty()))
      {
        m_paSortedProperties->push_back(*p);
      }

      std::sort(m_paSortedProperties->begin(), m_paSortedProperties->end());
    }

    ON_ASSERT(m_paSortedProperties != nullptr);

    if (m_iIndex >= int(m_paSortedProperties->size()))
      return nullptr;

    return &(*m_paSortedProperties)[m_iIndex++];
  }